

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O2

void __thiscall QSqlQueryModel::setQuery(QSqlQueryModel *this,QSqlQuery *query)

{
  QSqlRecord *other;
  QSqlQuery *this_00;
  long lVar1;
  QSqlQueryModelPrivate *this_01;
  long lVar2;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar3;
  QSqlErrorPrivate *pQVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  QSqlDriver *pQVar9;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QSqlError local_48;
  QSqlRecord newRec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlQueryModelPrivate **)&this->field_0x8;
  beginResetModel(this);
  newRec.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QSqlQuery::record((QSqlQuery *)&newRec);
  other = &this_01->rec;
  bVar5 = QSqlRecord::operator!=(&newRec,other);
  lVar2 = (this_01->colOffsets).super_QVLABase<int>.super_QVLABaseBase.s;
  iVar7 = QSqlRecord::count(&newRec);
  if ((bVar5) || (lVar2 != iVar7)) {
    iVar7 = QSqlRecord::count(&newRec);
    QSqlQueryModelPrivate::initColOffsets(this_01,iVar7);
  }
  (this_01->bottom).r = -1;
  (this_01->bottom).c = -1;
  (this_01->bottom).i = 0;
  (this_01->bottom).m.ptr = (QAbstractItemModel *)0x0;
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  QSqlError::QSqlError
            (&local_48,(QString *)&local_68,(QString *)&local_88,NoError,(QString *)&local_a8);
  QVar3.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)(this_01->error).d.d.ptr;
  (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_48.d.d.ptr;
  local_48.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar3.d.ptr;
  QSqlError::~QSqlError(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  this_00 = &this_01->query;
  QSqlQuery::operator=(this_00,query);
  QSqlRecord::operator=(other,&newRec);
  this_01->field_0x108 = this_01->field_0x108 | 1;
  bVar5 = QSqlQuery::isForwardOnly(this_00);
  if (bVar5) {
    latin1.m_data = "Forward-only queries cannot be used in a data model";
    latin1.m_size = 0x33;
    QString::QString((QString *)&local_68,latin1);
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QSqlError::QSqlError
              (&local_48,(QString *)&local_68,(QString *)&local_88,ConnectionError,
               (QString *)&local_a8);
    QVar3.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)(this_01->error).d.d.ptr;
    (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_48.d.d.ptr;
    local_48.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar3.d.ptr;
    QSqlError::~QSqlError(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  else {
    bVar5 = QSqlQuery::isActive(this_00);
    if (bVar5) {
      pQVar9 = QSqlQuery::driver(this_00);
      cVar6 = (**(code **)(*(long *)pQVar9 + 0xb8))(pQVar9,1);
      if (cVar6 == '\0') {
LAB_0012acd8:
        iVar7 = QSqlRecord::count(other);
        (this_01->bottom).r = -1;
        (this_01->bottom).c = iVar7 + -1;
        (this_01->bottom).i = 0;
        (this_01->bottom).m.ptr = (QAbstractItemModel *)this;
        this_01->field_0x108 = this_01->field_0x108 & 0xfe;
      }
      else {
        iVar7 = QSqlQuery::size(this_00);
        if (iVar7 < 1) goto LAB_0012acd8;
        iVar7 = QSqlQuery::size(this_00);
        iVar8 = QSqlRecord::count(other);
        (this_01->bottom).r = iVar7 + -1;
        (this_01->bottom).c = iVar8 + -1;
        (this_01->bottom).i = 0;
        (this_01->bottom).m.ptr = (QAbstractItemModel *)this;
      }
      local_68.d = (Data *)0xffffffffffffffff;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      (**(code **)(*(long *)this + 0x128))(this);
      endResetModel(this);
      (**(code **)(*(long *)this + 400))(this);
      goto LAB_0012ad3c;
    }
    QSqlQuery::lastError((QSqlQuery *)&local_68);
    pQVar4 = (this_01->error).d.d.ptr;
    (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_68.d;
    local_68.d = (Data *)pQVar4;
    QSqlError::~QSqlError((QSqlError *)&local_68);
  }
  endResetModel(this);
LAB_0012ad3c:
  QSqlRecord::~QSqlRecord(&newRec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlQueryModel::setQuery(QSqlQuery &&query)
{
    Q_D(QSqlQueryModel);
    beginResetModel();

    QSqlRecord newRec = query.record();
    bool columnsChanged = (newRec != d->rec);

    if (d->colOffsets.size() != newRec.count() || columnsChanged)
        d->initColOffsets(newRec.count());

    d->bottom = QModelIndex();
    d->error = QSqlError();
    d->query = std::move(query);
    d->rec = newRec;
    d->atEnd = true;

    if (d->query.isForwardOnly()) {
        d->error = QSqlError("Forward-only queries cannot be used in a data model"_L1,
                             QString(), QSqlError::ConnectionError);
        endResetModel();
        return;
    }

    if (!d->query.isActive()) {
        d->error = d->query.lastError();
        endResetModel();
        return;
    }

    if (d->query.driver()->hasFeature(QSqlDriver::QuerySize) && d->query.size() > 0) {
        d->bottom = createIndex(d->query.size() - 1, d->rec.count() - 1);
    } else {
        d->bottom = createIndex(-1, d->rec.count() - 1);
        d->atEnd = false;
    }


    // fetchMore does the rowsInserted stuff for incremental models
    fetchMore();

    endResetModel();
    queryChange();
}